

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CPscl cp_decl_spec(CPState *cp,CPDecl *decl,CPscl scl)

{
  GCstr *pGVar1;
  int iVar2;
  uint uVar3;
  uint in_EDX;
  CPDecl *in_RSI;
  CPDecl *in_RDI;
  CPState *unaff_retaddr;
  CTInfo info;
  uint32_t cbit;
  CTypeID tdef;
  uint32_t sz;
  uint32_t cds;
  CTInfo in_stack_0000068c;
  CPDecl *in_stack_00000690;
  CPState *in_stack_00000698;
  CTSize in_stack_ffffffffffffffc8;
  CTInfo in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  CPDeclIdx in_stack_ffffffffffffffd4;
  CTypeID local_20;
  uint local_1c;
  uint local_18;
  
  local_18 = 0;
  local_1c = 0;
  local_20 = 0;
  in_RSI->cp = (CPState *)in_RDI;
  in_RSI->mode = in_RDI->stack[2].size;
  in_RSI->name = (GCstr *)0x0;
  in_RSI->redir = (GCstr *)0x0;
  in_RSI->attr = 0;
  in_RSI->fattr = 0;
  in_RSI->top = 0;
  in_RSI->pos = 0;
  in_RSI->stack[0].next = 0;
  do {
    while ((cp_decl_attributes((CPState *)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                               (CPDecl *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)),
           (int)in_RDI->pos < 0x10d || (0x120 < (int)in_RDI->pos))) {
      if ((local_1c != 0) || ((local_20 != 0 || ((local_18 & 0x7a0) != 0)))) goto LAB_0016572b;
      in_stack_ffffffffffffffd4 = in_RDI->pos;
      if (in_stack_ffffffffffffffd4 == 0x24) {
        local_20 = in_RDI->mode;
        cp_next((CPState *)0x165720);
      }
      else if (in_stack_ffffffffffffffd4 == 0x100) {
        if ((in_RDI->name->nextgc).gcptr32 >> 0x1c != 7) goto LAB_0016572b;
        local_20 = (in_RDI->name->nextgc).gcptr32 & 0xffff;
        cp_next((CPState *)0x165703);
      }
      else if (in_stack_ffffffffffffffd4 == 0x127) {
        local_20 = cp_decl_struct(in_stack_00000698,in_stack_00000690,in_stack_0000068c);
      }
      else if (in_stack_ffffffffffffffd4 == 0x128) {
        local_20 = cp_decl_struct(in_stack_00000698,in_stack_00000690,in_stack_0000068c);
      }
      else {
        if (in_stack_ffffffffffffffd4 != 0x129) goto LAB_0016572b;
        local_20 = cp_decl_enum(unaff_retaddr,in_RDI);
      }
    }
    pGVar1 = in_RDI->name;
    iVar2._0_1_ = pGVar1->marked;
    iVar2._1_1_ = pGVar1->gct;
    iVar2._2_1_ = pGVar1->reserved;
    iVar2._3_1_ = pGVar1->unused;
    if (iVar2 != 0) {
      if (local_1c != 0) {
LAB_0016572b:
        if (((local_18 & 0x100) != 0) && (local_20 = 0x10, local_1c == 4)) {
          local_20 = 0xf;
        }
        if (local_20 == 0) {
          if ((local_18 & 1) == 0) {
            if ((local_18 & 2) == 0) {
              if ((local_18 & 0x10) == 0) {
                if ((local_18 & 4) == 0) {
                  if ((local_18 & 0x80) == 0) {
                    if ((local_18 & 0x40) == 0) {
                      if ((local_18 & 0x20) == 0) {
                        if (local_1c == 0) {
                          if ((local_18 & 0x600) == 0) {
                            cp_errmsg((CPState *)in_RDI,(CPToken)(ulong)in_RDI->pos,
                                      LJ_ERR_FFI_DECLSPEC);
                          }
                          local_1c = 4;
                        }
                      }
                      else {
                        local_1c = 8;
                      }
                    }
                    else {
                      local_1c = 8;
                    }
                  }
                  else {
                    local_1c = 2;
                  }
                }
              }
              else if ((local_18 & 0x20) != 0) {
                local_1c = 0x10;
              }
            }
            else {
              if ((local_18 & 0xfff079f5) != 0) {
                cp_errmsg((CPState *)in_RDI,0,LJ_ERR_FFI_INVTYPE);
              }
              if (local_1c == 0) {
                local_1c = 1;
              }
            }
            iVar2 = 0x1f;
            if (local_1c != 0) {
              for (; local_1c >> iVar2 == 0; iVar2 = iVar2 + -1) {
              }
            }
            cp_push((CPDecl *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
            in_RSI->attr = in_RSI->attr & 0xfcffffff;
          }
          else {
            cp_push((CPDecl *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
            in_RSI->attr = in_RSI->attr & 0xfcffffff;
          }
        }
        else {
          cp_push_type(in_RSI,in_EDX);
        }
        in_RSI->specpos = in_RSI->pos;
        in_RSI->specattr = in_RSI->attr;
        in_RSI->specfattr = in_RSI->fattr;
        return local_18 & 0xf8000;
      }
      pGVar1 = in_RDI->name;
      local_1c._0_1_ = pGVar1->marked;
      local_1c._1_1_ = pGVar1->gct;
      local_1c._2_1_ = pGVar1->reserved;
      local_1c._3_1_ = pGVar1->unused;
    }
    uVar3 = 1 << ((char)in_RDI->pos - 0xdU & 0x1f);
    local_18 = local_18 | uVar3 | (uVar3 & local_18 & 0x20) << 1;
    if ((int)in_RDI->pos < 0x11c) {
      if (local_20 != 0) goto LAB_0016572b;
    }
    else if ((in_EDX & uVar3) == 0) {
      cp_errmsg((CPState *)in_RDI,(CPToken)(ulong)in_RDI->pos,LJ_ERR_FFI_BADSCL);
    }
    cp_next((CPState *)0x16560c);
  } while( true );
}

Assistant:

static CPscl cp_decl_spec(CPState *cp, CPDecl *decl, CPscl scl)
{
  uint32_t cds = 0, sz = 0;
  CTypeID tdef = 0;

  decl->cp = cp;
  decl->mode = cp->mode;
  decl->name = NULL;
  decl->redir = NULL;
  decl->attr = 0;
  decl->fattr = 0;
  decl->pos = decl->top = 0;
  decl->stack[0].next = 0;

  for (;;) {  /* Parse basic types. */
    cp_decl_attributes(cp, decl);
    if (cp->tok >= CTOK_FIRSTDECL && cp->tok <= CTOK_LASTDECLFLAG) {
      uint32_t cbit;
      if (cp->ct->size) {
	if (sz) goto end_decl;
	sz = cp->ct->size;
      }
      cbit = (1u << (cp->tok - CTOK_FIRSTDECL));
      cds = cds | cbit | ((cbit & cds & CDF_LONG) << 1);
      if (cp->tok >= CTOK_FIRSTSCL) {
	if (!(scl & cbit)) cp_errmsg(cp, cp->tok, LJ_ERR_FFI_BADSCL);
      } else if (tdef) {
	goto end_decl;
      }
      cp_next(cp);
      continue;
    }
    if (sz || tdef ||
	(cds & (CDF_SHORT|CDF_LONG|CDF_SIGNED|CDF_UNSIGNED|CDF_COMPLEX)))
      break;
    switch (cp->tok) {
    case CTOK_STRUCT:
      tdef = cp_decl_struct(cp, decl, CTINFO(CT_STRUCT, 0));
      continue;
    case CTOK_UNION:
      tdef = cp_decl_struct(cp, decl, CTINFO(CT_STRUCT, CTF_UNION));
      continue;
    case CTOK_ENUM:
      tdef = cp_decl_enum(cp, decl);
      continue;
    case CTOK_IDENT:
      if (ctype_istypedef(cp->ct->info)) {
	tdef = ctype_cid(cp->ct->info);  /* Get typedef. */
	cp_next(cp);
	continue;
      }
      break;
    case '$':
      tdef = cp->val.id;
      cp_next(cp);
      continue;
    default:
      break;
    }
    break;
  }
end_decl:

  if ((cds & CDF_COMPLEX))  /* Use predefined complex types. */
    tdef = sz == 4 ? CTID_COMPLEX_FLOAT : CTID_COMPLEX_DOUBLE;

  if (tdef) {
    cp_push_type(decl, tdef);
  } else if ((cds & CDF_VOID)) {
    cp_push(decl, CTINFO(CT_VOID, (decl->attr & CTF_QUAL)), CTSIZE_INVALID);
    decl->attr &= ~CTF_QUAL;
  } else {
    /* Determine type info and size. */
    CTInfo info = CTINFO(CT_NUM, (cds & CDF_UNSIGNED) ? CTF_UNSIGNED : 0);
    if ((cds & CDF_BOOL)) {
      if ((cds & ~(CDF_SCL|CDF_BOOL|CDF_INT|CDF_SIGNED|CDF_UNSIGNED)))
	cp_errmsg(cp, 0, LJ_ERR_FFI_INVTYPE);
      info |= CTF_BOOL;
      if (!(cds & CDF_SIGNED)) info |= CTF_UNSIGNED;
      if (!sz) {
	sz = 1;
      }
    } else if ((cds & CDF_FP)) {
      info = CTINFO(CT_NUM, CTF_FP);
      if ((cds & CDF_LONG)) sz = sizeof(long double);
    } else if ((cds & CDF_CHAR)) {
      if ((cds & (CDF_CHAR|CDF_SIGNED|CDF_UNSIGNED)) == CDF_CHAR)
	info |= CTF_UCHAR;  /* Handle platforms where char is unsigned. */
    } else if ((cds & CDF_SHORT)) {
      sz = sizeof(short);
    } else if ((cds & CDF_LONGLONG)) {
      sz = 8;
    } else if ((cds & CDF_LONG)) {
      info |= CTF_LONG;
      sz = sizeof(long);
    } else if (!sz) {
      if (!(cds & (CDF_SIGNED|CDF_UNSIGNED)))
	cp_errmsg(cp, cp->tok, LJ_ERR_FFI_DECLSPEC);
      sz = sizeof(int);
    }
    lua_assert(sz != 0);
    info += CTALIGN(lj_fls(sz));  /* Use natural alignment. */
    info += (decl->attr & CTF_QUAL);  /* Merge qualifiers. */
    cp_push(decl, info, sz);
    decl->attr &= ~CTF_QUAL;
  }
  decl->specpos = decl->pos;
  decl->specattr = decl->attr;
  decl->specfattr = decl->fattr;
  return (cds & CDF_SCL);  /* Return storage class. */
}